

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InlinePass::IsInlinableFunctionCall(InlinePass *this,Instruction *inst)

{
  bool bVar1;
  Op OVar2;
  mapped_type *ppFVar3;
  Instruction *this_00;
  MessageConsumer *this_01;
  char *__args_3;
  spv_position_t local_c0;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string message;
  _Self local_40;
  _Self local_38;
  _Self local_30;
  iterator ci;
  uint32_t calleeFnId;
  Instruction *inst_local;
  InlinePass *this_local;
  
  OVar2 = opt::Instruction::opcode(inst);
  if (OVar2 == OpFunctionCall) {
    ci._M_node._4_4_ = opt::Instruction::GetSingleWordOperand(inst,2);
    local_30._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::find
                   (&this->inlinable_,(key_type_conflict *)((long)&ci._M_node + 4));
    local_38._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::cend
                   (&this->inlinable_);
    bVar1 = std::operator==(&local_30,&local_38);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      local_40._M_node =
           (_Base_ptr)
           std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::find
                     (&this->early_return_funcs_,(key_type_conflict *)((long)&ci._M_node + 4));
      message.field_2._8_8_ =
           std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                     (&this->early_return_funcs_);
      bVar1 = std::operator!=(&local_40,(_Self *)((long)&message.field_2 + 8));
      if (bVar1) {
        ppFVar3 = std::
                  unordered_map<unsigned_int,_spvtools::opt::Function_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>_>
                  ::operator[](&this->id2function_,(key_type *)((long)&ci._M_node + 4));
        this_00 = opt::Function::DefInst(*ppFVar3);
        opt::Instruction::PrettyPrint_abi_cxx11_(&local_a8,this_00,0);
        std::operator+(&local_88,"The function \'",&local_a8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                       ,&local_88,
                       "\' could not be inlined because the return instruction is not at the end of the function. This could be fixed by running merge-return before inlining."
                      );
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_a8);
        this_01 = Pass::consumer(&this->super_Pass);
        memset(&local_c0,0,0x18);
        __args_3 = (char *)std::__cxx11::string::c_str();
        std::
        function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
        operator()(this_01,SPV_MSG_WARNING,"",&local_c0,__args_3);
        this_local._7_1_ = false;
        std::__cxx11::string::~string((string *)local_68);
      }
      else {
        this_local._7_1_ = true;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool InlinePass::IsInlinableFunctionCall(const Instruction* inst) {
  if (inst->opcode() != spv::Op::OpFunctionCall) return false;
  const uint32_t calleeFnId =
      inst->GetSingleWordOperand(kSpvFunctionCallFunctionId);
  const auto ci = inlinable_.find(calleeFnId);
  if (ci == inlinable_.cend()) return false;

  if (early_return_funcs_.find(calleeFnId) != early_return_funcs_.end()) {
    // We rely on the merge-return pass to handle the early return case
    // in advance.
    std::string message =
        "The function '" + id2function_[calleeFnId]->DefInst().PrettyPrint() +
        "' could not be inlined because the return instruction "
        "is not at the end of the function. This could be fixed by "
        "running merge-return before inlining.";
    consumer()(SPV_MSG_WARNING, "", {0, 0, 0}, message.c_str());
    return false;
  }

  return true;
}